

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> __thiscall
mjs::parser::parse(parser *this)

{
  element_type *this_00;
  parser *in_RSI;
  ostringstream oss;
  statement_list local_1d8;
  statement_list local_1b8;
  undefined1 local_198 [376];
  
  local_1d8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  skip_whitespace(in_RSI);
  parse_statement_list(&local_1b8,in_RSI,1 < (int)in_RSI->version_);
  local_198._16_8_ =
       local_1d8.
       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_198._8_8_ =
       local_1d8.
       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_198._0_8_ =
       local_1d8.
       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1b8.
       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1d8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1b8.
       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1d8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1b8.
       super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector((vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             *)local_198);
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector(&local_1b8);
  expect_semicolon_allow_insertion(in_RSI,"parse",0x101);
  local_198._0_8_ =
       (in_RSI->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_198._8_8_ =
       (in_RSI->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_)->_M_use_count + 1;
    }
  }
  local_198._16_8_ = (ulong)(uint)(in_RSI->lexer_).text_pos_ << 0x20;
  this_00 = (element_type *)operator_new(0x40);
  block_statement::block_statement
            ((block_statement *)this_00,(source_extend *)local_198,&local_1d8,in_RSI->strict_mode_);
  (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
  }
  std::
  vector<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
  ::~vector(&local_1d8);
  return (__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
          )(__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<block_statement> parse() {

#ifdef PARSER_DEBUG
        std::wcout << "\nParsing '" << source_->text() << "'\n\n";
#endif

        statement_list l;

        try {
            skip_whitespace();
            l = parse_statement_list(version_ >= version::es5);
            EXPECT_SEMICOLON_ALLOW_INSERTION();
        } catch (const std::exception& e) {
            std::ostringstream oss;
            oss << source_extend{source_, token_start_, lexer_.text_position()} << ": " << e.what();
            throw std::runtime_error(oss.str());
        }

#ifdef PARSER_DEBUG
        std::wcout << "\n\n";
#endif
        return std::make_unique<block_statement>(source_extend{source_, 0, lexer_.text_position()}, std::move(l), strict_mode_);
    }